

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightmapper.h
# Opt level: O3

lm_context *
lmCreate(int hemisphereSize,float zNear,float zFar,float clearR,float clearG,float clearB,
        int interpolationPasses,float interpolationThreshold,float cameraToSurfaceDistanceModifier)

{
  GLuint *pGVar1;
  GLuint *pGVar2;
  GLuint *pGVar3;
  GLuint *pGVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  GLenum GVar8;
  GLuint GVar9;
  lm_context *ctx;
  lm_ivec2 *plVar10;
  uint *puVar11;
  uint uVar12;
  GLuint *fp;
  char *fp_00;
  long lVar13;
  uint *puVar14;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  if (hemisphereSize < 0x80) {
    if ((0x30 < hemisphereSize - 0x10U) ||
       ((0x1000000010001U >> ((ulong)(hemisphereSize - 0x10U) & 0x3f) & 1) == 0)) {
LAB_00163cb1:
      __assert_fail("hemisphereSize == 512 || hemisphereSize == 256 || hemisphereSize == 128 || hemisphereSize == 64 || hemisphereSize == 32 || hemisphereSize == 16"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                    ,0x480,
                    "lm_context *lmCreate(int, float, float, float, float, float, int, float, float)"
                   );
    }
  }
  else if (((hemisphereSize != 0x80) && (hemisphereSize != 0x100)) && (hemisphereSize != 0x200))
  goto LAB_00163cb1;
  if ((zNear <= 0.0) || (zFar <= zNear)) {
    __assert_fail("zNear < zFar && zNear > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                  ,0x481,
                  "lm_context *lmCreate(int, float, float, float, float, float, int, float, float)")
    ;
  }
  if (cameraToSurfaceDistanceModifier < -1.0) {
    __assert_fail("cameraToSurfaceDistanceModifier >= -1.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                  ,0x482,
                  "lm_context *lmCreate(int, float, float, float, float, float, int, float, float)")
    ;
  }
  if ((uint)interpolationPasses < 9) {
    if (interpolationThreshold < 0.0) {
      __assert_fail("interpolationThreshold >= 0.0f",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                    ,0x484,
                    "lm_context *lmCreate(int, float, float, float, float, float, int, float, float)"
                   );
    }
    ctx = (lm_context *)calloc(1,0x1f0);
    (ctx->meshPosition).passCount = interpolationPasses * 3 + 1;
    ctx->interpolationThreshold = interpolationThreshold;
    (ctx->hemisphere).size = hemisphereSize;
    (ctx->hemisphere).zNear = zNear;
    (ctx->hemisphere).zFar = zFar;
    (ctx->hemisphere).cameraToSurfaceDistanceModifier = cameraToSurfaceDistanceModifier;
    (ctx->hemisphere).clearColor.r = clearR;
    (ctx->hemisphere).clearColor.g = clearG;
    (ctx->hemisphere).clearColor.b = clearB;
    lVar13 = 0;
    local_3c = 0x600 / (hemisphereSize * 3 & 0xffffU);
    (ctx->hemisphere).fbHemiCountX = local_3c;
    uVar12 = 0x200 / (hemisphereSize & 0xffffU);
    (ctx->hemisphere).fbHemiCountY = uVar12;
    local_3c = local_3c * hemisphereSize;
    uVar5 = local_3c * 3;
    puVar14 = &local_34;
    local_3c = local_3c >> 1;
    uVar12 = uVar12 * hemisphereSize;
    puVar11 = &local_38;
    local_40 = uVar12 >> 1;
    pGVar1 = (ctx->hemisphere).fbTexture;
    local_38 = uVar12;
    local_34 = uVar5;
    (*glad_glGenTextures)(2,pGVar1);
    pGVar2 = (ctx->hemisphere).fb;
    (*glad_glGenFramebuffers)(2,pGVar2);
    pGVar3 = &(ctx->hemisphere).fbDepth;
    (*glad_glGenRenderbuffers)(1,pGVar3);
    (*glad_glBindRenderbuffer)(0x8d41,(ctx->hemisphere).fbDepth);
    (*glad_glRenderbufferStorage)(0x8d41,0x81a5,uVar5,uVar12);
    (*glad_glBindFramebuffer)(0x8d40,(ctx->hemisphere).fb[0]);
    (*glad_glFramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,(ctx->hemisphere).fbDepth);
    bVar7 = true;
    do {
      bVar6 = bVar7;
      (*glad_glBindTexture)(0xde1,pGVar1[lVar13]);
      (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
      (*glad_glTexImage2D)(0xde1,0,0x8814,*puVar14,*puVar11,0,0x1908,0x1406,(void *)0x0);
      (*glad_glBindFramebuffer)(0x8d40,pGVar2[lVar13]);
      (*glad_glFramebufferTexture2D)(0x8d40,0x8ce0,0xde1,pGVar1[lVar13],0);
      GVar8 = (*glad_glCheckFramebufferStatus)(0x8d40);
      if (GVar8 != 0x8cd5) {
        lmCreate_cold_1();
        return (lm_context *)0x0;
      }
      lVar13 = 1;
      puVar11 = &local_40;
      puVar14 = &local_3c;
      bVar7 = false;
    } while (bVar6);
    (*glad_glBindFramebuffer)(0x8d40,0);
    pGVar4 = &(ctx->hemisphere).vao;
    fp = pGVar4;
    (*glad_glGenVertexArrays)(1,pGVar4);
    GVar9 = lm_LoadProgram("#version 150 core\nuniform sampler2D hemispheres;\nuniform sampler2D weights;\nlayout(pixel_center_integer) in vec4 gl_FragCoord;\nout vec4 outColor;\nvec4 weightedSample(ivec2 h_uv, ivec2 w_uv, ivec2 quadrant)\n{\nvec4 sample = texelFetch(hemispheres, h_uv + quadrant, 0);\nvec2 weight = texelFetch(weights, w_uv + quadrant, 0).rg;\nreturn vec4(sample.rgb * weight.r, sample.a * weight.g);\n}\nvec4 threeWeightedSamples(ivec2 h_uv, ivec2 w_uv, ivec2 offset)\n{\nvec4 sum = weightedSample(h_uv, w_uv, offset);\nsum += weightedSample(h_uv, w_uv, offset + ivec2(2, 0));\nsum += weightedSample(h_uv, w_uv, offset + ivec2(4, 0));\nreturn sum;\n}\nvoid main()\n{\nvec2 in_uv = gl_FragCoord.xy * vec2(6.0, 2.0) + vec2(0.5);\nivec2 h_uv = ivec2(in_uv);\nivec2 w_uv = ivec2(mod(in_uv, vec2(textureSize(weights, 0))));\nvec4 lb = threeWeightedSamples(h_uv, w_uv, ivec2(0, 0));\nvec4 rb = threeWeightedSamples(h_uv, w_uv, ivec2(1, 0));\nvec4 lt = threeWeightedSamples(h_uv, w_uv, ivec2(0, 1));\nvec4 rt = threeWeightedSamples(h_uv, w_uv, ivec2(1, 1));\noutColor = lb + rb + lt + rt;\n}\n"
                           ,(char *)fp);
    (ctx->hemisphere).firstPass.programID = GVar9;
    if (GVar9 == 0) {
      fwrite("Error loading the hemisphere first pass shader program... leaving!\n",0x43,1,_stderr);
    }
    else {
      GVar9 = (*glad_glGetUniformLocation)(GVar9,"hemispheres");
      (ctx->hemisphere).firstPass.hemispheresTextureID = GVar9;
      fp_00 = "weights";
      GVar9 = (*glad_glGetUniformLocation)((ctx->hemisphere).firstPass.programID,"weights");
      (ctx->hemisphere).firstPass.weightsTextureID = GVar9;
      GVar9 = lm_LoadProgram("#version 150 core\nuniform sampler2D hemispheres;\nlayout(pixel_center_integer) in vec4 gl_FragCoord;\nout vec4 outColor;\nvoid main()\n{\nivec2 h_uv = ivec2(gl_FragCoord.xy) * 2;\nvec4 lb = texelFetch(hemispheres, h_uv + ivec2(0, 0), 0);\nvec4 rb = texelFetch(hemispheres, h_uv + ivec2(1, 0), 0);\nvec4 lt = texelFetch(hemispheres, h_uv + ivec2(0, 1), 0);\nvec4 rt = texelFetch(hemispheres, h_uv + ivec2(1, 1), 0);\noutColor = lb + rb + lt + rt;\n}\n"
                             ,fp_00);
      (ctx->hemisphere).downsamplePass.programID = GVar9;
      if (GVar9 != 0) {
        GVar9 = (*glad_glGetUniformLocation)(GVar9,"hemispheres");
        (ctx->hemisphere).downsamplePass.hemispheresTextureID = GVar9;
        (*glad_glGenTextures)(1,&(ctx->hemisphere).firstPass.weightsTexture);
        lmSetHemisphereWeights(ctx,lm_defaultWeights,(void *)0x0);
        (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
        (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
        (*glad_glTexParameteri)(0xde1,0x2802,0x2901);
        (*glad_glTexParameteri)(0xde1,0x2803,0x2901);
        plVar10 = (lm_ivec2 *)
                  calloc((ulong)((ctx->hemisphere).fbHemiCountY * (ctx->hemisphere).fbHemiCountX),8)
        ;
        (ctx->hemisphere).fbHemiToLightmapLocation = plVar10;
        return ctx;
      }
      fwrite("Error loading the hemisphere downsample pass shader program... leaving!\n",0x48,1,
             _stderr);
      (*glad_glDeleteProgram)((ctx->hemisphere).firstPass.programID);
    }
    (*glad_glDeleteVertexArrays)(1,pGVar4);
    (*glad_glDeleteRenderbuffers)(1,pGVar3);
    (*glad_glDeleteFramebuffers)(2,pGVar2);
    (*glad_glDeleteTextures)(2,pGVar1);
    free(ctx);
    return (lm_context *)0x0;
  }
  __assert_fail("interpolationPasses >= 0 && interpolationPasses <= 8",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/lightmapper/lightmapper.h"
                ,0x483,
                "lm_context *lmCreate(int, float, float, float, float, float, int, float, float)");
}

Assistant:

lm_context *lmCreate(int hemisphereSize, float zNear, float zFar,
	float clearR, float clearG, float clearB,
	int interpolationPasses, float interpolationThreshold,
	float cameraToSurfaceDistanceModifier)
{
	assert(hemisphereSize == 512 || hemisphereSize == 256 || hemisphereSize == 128 ||
		   hemisphereSize ==  64 || hemisphereSize ==  32 || hemisphereSize ==  16);
	assert(zNear < zFar && zNear > 0.0f);
	assert(cameraToSurfaceDistanceModifier >= -1.0f);
	assert(interpolationPasses >= 0 && interpolationPasses <= 8);
	assert(interpolationThreshold >= 0.0f);

	lm_context *ctx = (lm_context*)LM_CALLOC(1, sizeof(lm_context));

	ctx->meshPosition.passCount = 1 + 3 * interpolationPasses;
	ctx->interpolationThreshold = interpolationThreshold;
	ctx->hemisphere.size = hemisphereSize;
	ctx->hemisphere.zNear = zNear;
	ctx->hemisphere.zFar = zFar;
	ctx->hemisphere.cameraToSurfaceDistanceModifier = cameraToSurfaceDistanceModifier;
	ctx->hemisphere.clearColor.r = clearR;
	ctx->hemisphere.clearColor.g = clearG;
	ctx->hemisphere.clearColor.b = clearB;

	// calculate hemisphere batch size
	ctx->hemisphere.fbHemiCountX = 1536 / (3 * ctx->hemisphere.size);
	ctx->hemisphere.fbHemiCountY = 512 / ctx->hemisphere.size;

	// hemisphere batch framebuffers
	unsigned int w[] = {
		ctx->hemisphere.fbHemiCountX * ctx->hemisphere.size * 3,
		ctx->hemisphere.fbHemiCountX * ctx->hemisphere.size / 2 };
	unsigned int h[] = {
		ctx->hemisphere.fbHemiCountY * ctx->hemisphere.size,
		ctx->hemisphere.fbHemiCountY * ctx->hemisphere.size / 2 };

	glGenTextures(2, ctx->hemisphere.fbTexture);
	glGenFramebuffers(2, ctx->hemisphere.fb);
	glGenRenderbuffers(1, &ctx->hemisphere.fbDepth);

	glBindRenderbuffer(GL_RENDERBUFFER, ctx->hemisphere.fbDepth);
	glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT16, w[0], h[0]);
	glBindFramebuffer(GL_FRAMEBUFFER, ctx->hemisphere.fb[0]);
	glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, ctx->hemisphere.fbDepth);
	for (int i = 0; i < 2; i++)
	{
		glBindTexture(GL_TEXTURE_2D, ctx->hemisphere.fbTexture[i]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F, w[i], h[i], 0, GL_RGBA, GL_FLOAT, 0);

		glBindFramebuffer(GL_FRAMEBUFFER, ctx->hemisphere.fb[i]);
		glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, ctx->hemisphere.fbTexture[i], 0);
		GLenum status = glCheckFramebufferStatus(GL_FRAMEBUFFER);
		if (status != GL_FRAMEBUFFER_COMPLETE)
		{
			fprintf(stderr, "Could not create framebuffer!\n");
			glDeleteRenderbuffers(1, &ctx->hemisphere.fbDepth);
			glDeleteFramebuffers(2, ctx->hemisphere.fb);
			glDeleteTextures(2, ctx->hemisphere.fbTexture);
			LM_FREE(ctx);
			return NULL;
		}
	}
	glBindFramebuffer(GL_FRAMEBUFFER, 0);

	// dummy vao for fullscreen quad rendering
	glGenVertexArrays(1, &ctx->hemisphere.vao);

	// hemisphere shader (weighted downsampling of the 3x1 hemisphere layout to a 0.5x0.5 square)
	{
		const char *vs =
			"#version 150 core\n"
			"const vec2 ps[4] = vec2[](vec2(1, -1), vec2(1, 1), vec2(-1, -1), vec2(-1, 1));\n"
			"void main()\n"
			"{\n"
				"gl_Position = vec4(ps[gl_VertexID], 0, 1);\n"
			"}\n";
		const char *fs =
			"#version 150 core\n"
			"uniform sampler2D hemispheres;\n"
			"uniform sampler2D weights;\n"

			"layout(pixel_center_integer) in vec4 gl_FragCoord;\n" // whole integer values represent pixel centers, GL_ARB_fragment_coord_conventions

			"out vec4 outColor;\n"

			"vec4 weightedSample(ivec2 h_uv, ivec2 w_uv, ivec2 quadrant)\n"
			"{\n"
				"vec4 sample = texelFetch(hemispheres, h_uv + quadrant, 0);\n"
				"vec2 weight = texelFetch(weights, w_uv + quadrant, 0).rg;\n"
				"return vec4(sample.rgb * weight.r, sample.a * weight.g);\n"
			"}\n"

			"vec4 threeWeightedSamples(ivec2 h_uv, ivec2 w_uv, ivec2 offset)\n"
			"{\n" // horizontal triple sum
				"vec4 sum = weightedSample(h_uv, w_uv, offset);\n"
				"sum += weightedSample(h_uv, w_uv, offset + ivec2(2, 0));\n"
				"sum += weightedSample(h_uv, w_uv, offset + ivec2(4, 0));\n"
				"return sum;\n"
			"}\n"

			"void main()\n"
			"{\n" // this is a weighted sum downsampling pass (alpha component contains the weighted valid sample count)
				"vec2 in_uv = gl_FragCoord.xy * vec2(6.0, 2.0) + vec2(0.5);\n"
				"ivec2 h_uv = ivec2(in_uv);\n"
				"ivec2 w_uv = ivec2(mod(in_uv, vec2(textureSize(weights, 0))));\n" // there's no integer modulo :(
				"vec4 lb = threeWeightedSamples(h_uv, w_uv, ivec2(0, 0));\n"
				"vec4 rb = threeWeightedSamples(h_uv, w_uv, ivec2(1, 0));\n"
				"vec4 lt = threeWeightedSamples(h_uv, w_uv, ivec2(0, 1));\n"
				"vec4 rt = threeWeightedSamples(h_uv, w_uv, ivec2(1, 1));\n"
				"outColor = lb + rb + lt + rt;\n"
			"}\n";
		ctx->hemisphere.firstPass.programID = lm_LoadProgram(vs, fs);
		if (!ctx->hemisphere.firstPass.programID)
		{
			fprintf(stderr, "Error loading the hemisphere first pass shader program... leaving!\n");
			glDeleteVertexArrays(1, &ctx->hemisphere.vao);
			glDeleteRenderbuffers(1, &ctx->hemisphere.fbDepth);
			glDeleteFramebuffers(2, ctx->hemisphere.fb);
			glDeleteTextures(2, ctx->hemisphere.fbTexture);
			LM_FREE(ctx);
			return NULL;
		}
		ctx->hemisphere.firstPass.hemispheresTextureID = glGetUniformLocation(ctx->hemisphere.firstPass.programID, "hemispheres");
		ctx->hemisphere.firstPass.weightsTextureID = glGetUniformLocation(ctx->hemisphere.firstPass.programID, "weights");
	}

	// downsample shader
	{
		const char *vs =
			"#version 150 core\n"
			"const vec2 ps[4] = vec2[](vec2(1, -1), vec2(1, 1), vec2(-1, -1), vec2(-1, 1));\n"
			"void main()\n"
			"{\n"
				"gl_Position = vec4(ps[gl_VertexID], 0, 1);\n"
			"}\n";
		const char *fs =
			"#version 150 core\n"
			"uniform sampler2D hemispheres;\n"

			"layout(pixel_center_integer) in vec4 gl_FragCoord;\n" // whole integer values represent pixel centers, GL_ARB_fragment_coord_conventions

			"out vec4 outColor;\n"

			"void main()\n"
			"{\n" // this is a sum downsampling pass (alpha component contains the weighted valid sample count)
				"ivec2 h_uv = ivec2(gl_FragCoord.xy) * 2;\n"
				"vec4 lb = texelFetch(hemispheres, h_uv + ivec2(0, 0), 0);\n"
				"vec4 rb = texelFetch(hemispheres, h_uv + ivec2(1, 0), 0);\n"
				"vec4 lt = texelFetch(hemispheres, h_uv + ivec2(0, 1), 0);\n"
				"vec4 rt = texelFetch(hemispheres, h_uv + ivec2(1, 1), 0);\n"
				"outColor = lb + rb + lt + rt;\n"
			"}\n";
		ctx->hemisphere.downsamplePass.programID = lm_LoadProgram(vs, fs);
		if (!ctx->hemisphere.downsamplePass.programID)
		{
			fprintf(stderr, "Error loading the hemisphere downsample pass shader program... leaving!\n");
			glDeleteProgram(ctx->hemisphere.firstPass.programID);
			glDeleteVertexArrays(1, &ctx->hemisphere.vao);
			glDeleteRenderbuffers(1, &ctx->hemisphere.fbDepth);
			glDeleteFramebuffers(2, ctx->hemisphere.fb);
			glDeleteTextures(2, ctx->hemisphere.fbTexture);
			LM_FREE(ctx);
			return NULL;
		}
		ctx->hemisphere.downsamplePass.hemispheresTextureID = glGetUniformLocation(ctx->hemisphere.downsamplePass.programID, "hemispheres");
	}

	// hemisphere weights texture
	glGenTextures(1, &ctx->hemisphere.firstPass.weightsTexture);
	lmSetHemisphereWeights(ctx, lm_defaultWeights, 0);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_REPEAT);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_REPEAT);

	// allocate batchPosition-to-lightmapPosition map
	ctx->hemisphere.fbHemiToLightmapLocation = (lm_ivec2*)LM_CALLOC(ctx->hemisphere.fbHemiCountX * ctx->hemisphere.fbHemiCountY, sizeof(lm_ivec2));

	return ctx;
}